

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

string * __thiscall
cmOutputConverter::ConvertToRelativePath
          (string *__return_storage_ptr__,cmOutputConverter *this,string *param_1,
          string *remote_path)

{
  bool bVar1;
  cmStateDirectory cStack_48;
  
  cmStateSnapshot::GetDirectory(&cStack_48,&this->StateSnapshot);
  bVar1 = ContainedInDirectory(param_1,remote_path,&cStack_48);
  if (bVar1) {
    ForceToRelativePath(__return_storage_ptr__,param_1,remote_path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertToRelativePath(
  std::string const& local_path, std::string const& remote_path) const
{
  if (!ContainedInDirectory(local_path, remote_path,
                            this->StateSnapshot.GetDirectory())) {
    return remote_path;
  }

  return this->ForceToRelativePath(local_path, remote_path);
}